

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

int main(void)

{
  long lVar1;
  int j_1;
  int iVar2;
  int j;
  long lVar3;
  GlobalFunctionTest *in_RDI;
  ViewTest *pVVar4;
  MarrayTest *this;
  ViewTest t;
  undefined4 auStack_31c [43];
  undefined8 uStack_270;
  ViewTest local_25c;
  
  uStack_270 = 0x140d19;
  GlobalFunctionTest::shapeStrideTest(in_RDI);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140d58;
  ViewTest::coordinatesToOffsetTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140d95;
  ViewTest::coordinatesToOffsetTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140dd2;
  ViewTest::coordinatesToIndexTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140e0f;
  ViewTest::coordinatesToIndexTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140e4c;
  ViewTest::indexToCoordinatesTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140e89;
  ViewTest::indexToCoordinatesTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140ec6;
  ViewTest::indexToOffsetTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140f03;
  ViewTest::indexToOffsetTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140f40;
  ViewTest::emptyConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140f7d;
  ViewTest::emptyConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140fba;
  ViewTest::scalarConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x140ff7;
  ViewTest::scalarConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141034;
  ViewTest::shapeConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141071;
  ViewTest::shapeConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1410ae;
  ViewTest::shapeAssignTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1410eb;
  ViewTest::shapeAssignTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141128;
  ViewTest::shapeStrideConstructorTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141165;
  ViewTest::shapeStrideConstructorTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1411a2;
  ViewTest::shapeStrideAssignTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1411df;
  ViewTest::shapeStrideAssignTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x14121c;
  ViewTest::copyConstructorTest(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141259;
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)1>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141296;
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)0>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1412d3;
  ViewTest::queryTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141310;
  ViewTest::queryTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x14134d;
  ViewTest::elementAccessTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x14138a;
  ViewTest::elementAccessTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1413c7;
  ViewTest::subViewsTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141404;
  ViewTest::subViewsTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141441;
  ViewTest::subConstViewsTest(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x14147e;
  ViewTest::iteratorAccessTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1414bb;
  ViewTest::iteratorAccessTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1414f8;
  ViewTest::coordinateBindingTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141535;
  ViewTest::coordinateBindingTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141572;
  ViewTest::transposeTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1415af;
  ViewTest::transposeTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1415ec;
  ViewTest::permuteTest<false>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141629;
  ViewTest::permuteTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141666;
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)1>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1416a3;
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)0>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x1416e0;
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)1>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x14171d;
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)0>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x14175a;
  ViewTest::arithmeticOperatorsTest(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141797;
  ViewTest::asStringTest<true>(&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  pVVar4 = &local_25c;
  uStack_270 = 0x1417d1;
  ViewTest::asStringTest<false>(pVVar4);
  lVar3 = 0x18;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 100;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  uStack_270 = 0x1417ea;
  ViewTest::reshapeTest(pVVar4);
  lVar3 = 0x18;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 100;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  uStack_270 = 0x141803;
  ViewTest::overlapTreatmentTest(pVVar4);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x14181d;
  IteratorTest::constructorTest<false>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x141837;
  IteratorTest::constructorTest<true>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x141851;
  IteratorTest::accessIteratorOperations<false>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x14186b;
  IteratorTest::accessIteratorOperations<true>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x141885;
  IteratorTest::arithmeticOperatorsTest<false>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x14189f;
  IteratorTest::arithmeticOperatorsTest<true>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x1418b9;
  IteratorTest::comparisonOperators<false>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x1418d3;
  IteratorTest::comparisonOperators<true>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x1418ed;
  IteratorTest::hasMoreTest<false>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x141907;
  IteratorTest::hasMoreTest<true>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x141921;
  IteratorTest::indexTest<false>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x14193b;
  IteratorTest::indexTest<true>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x141955;
  IteratorTest::coordinateTest<false>((IteratorTest *)&local_25c);
  lVar3 = 0;
  do {
    *(int *)((long)local_25c.data_ + lVar3 * 2 + -4) = (int)lVar3;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x30);
  uStack_270 = 0x141972;
  IteratorTest::coordinateTest<true>((IteratorTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  this = (MarrayTest *)&local_25c;
  uStack_270 = 0x1419ac;
  MarrayTest::constructorTest(this);
  lVar3 = 0x18;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 100;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  uStack_270 = 0x1419c5;
  MarrayTest::assignTest(this);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141a04;
  MarrayTest::copyConstructorTest<false>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141a41;
  MarrayTest::copyConstructorTest<true>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141a7e;
  MarrayTest::assignmentOperatorTest<false>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141abb;
  MarrayTest::assignmentOperatorTest<true>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141af8;
  MarrayTest::reshapeTest((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141b35;
  MarrayTest::resizeTest<(andres::CoordinateOrder)1>((MarrayTest *)&local_25c);
  local_25c.scalar_ = 0x2a;
  iVar2 = 0;
  lVar3 = 0;
  do {
    local_25c.data_[lVar3] = (int)lVar3;
    local_25c.data2x_[lVar3] = iVar2;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 2;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    local_25c.data100_[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  uStack_270 = 0x141b6f;
  MarrayTest::resizeTest<(andres::CoordinateOrder)0>((MarrayTest *)&local_25c);
  lVar3 = 0;
  do {
    lVar1 = lVar3 + 1;
    local_25c.data_[lVar3 + -1] = (int)lVar1;
    lVar3 = lVar1;
  } while (lVar1 != 0x18);
  uStack_270 = 0x141b8c;
  ExpressionTemplateTest::constructionAndAssignmentTest((ExpressionTemplateTest *)&local_25c);
  lVar3 = 0;
  do {
    lVar1 = lVar3 + 1;
    local_25c.data_[lVar3 + -1] = (int)lVar1;
    lVar3 = lVar1;
  } while (lVar1 != 0x18);
  uStack_270 = 0x141ba9;
  ExpressionTemplateTest::arithmeticOperatorsTest((ExpressionTemplateTest *)&local_25c);
  lVar3 = 0x30;
  do {
    *(short *)((long)local_25c.data_ + lVar3 * 2 + -4) = (short)(lVar3 + -0x2f);
    auStack_31c[lVar3] = (int)(lVar3 + -0x2f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x48);
  uStack_270 = 0x141bd1;
  DifferingTypesTest::constructionTest((DifferingTypesTest *)&local_25c);
  lVar3 = 0x30;
  do {
    *(short *)((long)local_25c.data_ + lVar3 * 2 + -4) = (short)(lVar3 + -0x2f);
    auStack_31c[lVar3] = (int)(lVar3 + -0x2f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x48);
  uStack_270 = 0x141bf9;
  DifferingTypesTest::assignmentTest((DifferingTypesTest *)&local_25c);
  lVar3 = 0x30;
  do {
    *(short *)((long)local_25c.data_ + lVar3 * 2 + -4) = (short)(lVar3 + -0x2f);
    auStack_31c[lVar3] = (int)(lVar3 + -0x2f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x48);
  pVVar4 = &local_25c;
  uStack_270 = 0x141c21;
  DifferingTypesTest::arithmeticOperatorsTest((DifferingTypesTest *)pVVar4);
  lVar3 = 0x18;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  uStack_270 = 0x141c30;
  DifferingTypesTest::nonBasicTypesTest((DifferingTypesTest *)pVVar4);
  lVar3 = 0x18;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  uStack_270 = 0x141c3f;
  DifferingTypesTest::typePromotionTest((DifferingTypesTest *)pVVar4);
  uStack_270 = 0x141c5a;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"All tests have been passed.",0x1b);
  uStack_270 = 0x141c6e;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  uStack_270 = 0x141c79;
  std::ostream::put('\0');
  uStack_270 = 0x141c81;
  std::ostream::flush();
  return 0;
}

Assistant:

int main() 
{
    { GlobalFunctionTest t; t.shapeStrideTest(); }

    { ViewTest t; t.coordinatesToOffsetTest<false>(); }
    { ViewTest t; t.coordinatesToOffsetTest<true>(); }
    { ViewTest t; t.coordinatesToIndexTest<false>(); }
    { ViewTest t; t.coordinatesToIndexTest<true>(); }
    { ViewTest t; t.indexToCoordinatesTest<false>(); }
    { ViewTest t; t.indexToCoordinatesTest<true>(); }
    { ViewTest t; t.indexToOffsetTest<false>(); }
    { ViewTest t; t.indexToOffsetTest<true>(); }
    { ViewTest t; t.emptyConstructorTest<false>(); }
    { ViewTest t; t.emptyConstructorTest<true>(); }
    { ViewTest t; t.scalarConstructorTest<false>(); }
    { ViewTest t; t.scalarConstructorTest<true>(); }
    { ViewTest t; t.shapeConstructorTest<false>(); }
    { ViewTest t; t.shapeConstructorTest<true>(); }
    { ViewTest t; t.shapeAssignTest<false>(); }
    { ViewTest t; t.shapeAssignTest<true>(); }
    { ViewTest t; t.shapeStrideConstructorTest<false>(); }
    { ViewTest t; t.shapeStrideConstructorTest<true>(); } 
    { ViewTest t; t.shapeStrideAssignTest<false>(); }
    { ViewTest t; t.shapeStrideAssignTest<true>(); }
    { ViewTest t; t.copyConstructorTest(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::LastMajorOrder>(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::FirstMajorOrder>(); }
    { ViewTest t; t.queryTest<false>(); }
    { ViewTest t; t.queryTest<true>(); }
    { ViewTest t; t.elementAccessTest<false>(); }
    { ViewTest t; t.elementAccessTest<true>(); }
    { ViewTest t; t.subViewsTest<false>(); }
    { ViewTest t; t.subViewsTest<true>(); }
    { ViewTest t; t.subConstViewsTest(); }
    { ViewTest t; t.iteratorAccessTest<false>(); }
    { ViewTest t; t.iteratorAccessTest<true>(); } 
    { ViewTest t; t.coordinateBindingTest<false>(); }
    { ViewTest t; t.coordinateBindingTest<true>(); }
    { ViewTest t; t.transposeTest<false>(); }
    { ViewTest t; t.transposeTest<true>(); }
    { ViewTest t; t.permuteTest<false>(); }
    { ViewTest t; t.permuteTest<true>(); } 
    { ViewTest t; t.shiftOperatorTest<false, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<false, andres::FirstMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::FirstMajorOrder>(); } 
    { ViewTest t; t.arithmeticOperatorsTest(); }
    { ViewTest t; t.asStringTest<true>(); } 
    { ViewTest t; t.asStringTest<false>(); } 
    { ViewTest t; t.reshapeTest(); }
    { ViewTest t; t.overlapTreatmentTest(); }
    { ViewTest t; t.compatibilityFunctionsTest(); }

    { IteratorTest t; t.constructorTest<false>(); }
    { IteratorTest t; t.constructorTest<true>(); }
    { IteratorTest t; t.accessIteratorOperations<false>(); }
    { IteratorTest t; t.accessIteratorOperations<true>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<false>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<true>(); }
    { IteratorTest t; t.comparisonOperators<false>(); }
    { IteratorTest t; t.comparisonOperators<true>(); }
    { IteratorTest t; t.hasMoreTest<false>(); }
    { IteratorTest t; t.hasMoreTest<true>(); }
    { IteratorTest t; t.indexTest<false>(); }
    { IteratorTest t; t.indexTest<true>(); }
    { IteratorTest t; t.coordinateTest<false>(); }
    { IteratorTest t; t.coordinateTest<true>(); }

    { MarrayTest t; t.constructorTest(); } 
    { MarrayTest t; t.assignTest(); } 
    { MarrayTest t; t.copyConstructorTest<false>(); }
    { MarrayTest t; t.copyConstructorTest<true>(); }
    { MarrayTest t; t.assignmentOperatorTest<false>(); }
    { MarrayTest t; t.assignmentOperatorTest<true>(); }
    { MarrayTest t; t.reshapeTest(); } 
    { MarrayTest t; t.resizeTest<andres::LastMajorOrder>(); } 
    { MarrayTest t; t.resizeTest<andres::FirstMajorOrder>(); } 

    { ExpressionTemplateTest t; t.constructionAndAssignmentTest(); }
    { ExpressionTemplateTest t; t.arithmeticOperatorsTest(); }

    { DifferingTypesTest t; t.constructionTest(); }
    { DifferingTypesTest t; t.assignmentTest(); }
    { DifferingTypesTest t; t.arithmeticOperatorsTest(); }
    { DifferingTypesTest t; t.nonBasicTypesTest(); }
    { DifferingTypesTest t; t.typePromotionTest(); }

    #ifdef HAVE_CPP0X_INITIALIZER_LISTS
    { Cpp0xTest t; t.test(); }
    #endif

    std::cout << "All tests have been passed." << std::endl;
    return 0;
}